

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  reference ppcVar5;
  size_type sVar6;
  reference ppcVar7;
  cmMakefile *pcVar8;
  string local_390;
  allocator local_369;
  undefined1 local_368 [8];
  string outP;
  size_t i;
  __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
  local_338;
  const_iterator gi;
  vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *testers;
  string local_320;
  char *local_300;
  char *testIncludeFile;
  cmGeneratedFileStream fout;
  string local_a8 [8];
  string file;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  allocator local_31;
  string local_30;
  cmLocalGenerator *local_10;
  cmLocalGenerator *this_local;
  
  pcVar8 = this->Makefile;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CMAKE_TESTING_ENABLED",&local_31);
  bVar2 = cmMakefile::IsOn(pcVar8,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config);
    cmMakefile::GetConfigurations
              ((string *)((long)&file.field_2 + 8),this->Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config,false);
    pcVar3 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar3,(allocator *)&fout.field_0x247);
    std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x247);
    std::__cxx11::string::operator+=(local_a8,"/");
    std::__cxx11::string::operator+=(local_a8,"CTestTestfile.cmake");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&testIncludeFile,pcVar3,false);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&testIncludeFile,true);
    poVar4 = std::operator<<((ostream *)&testIncludeFile,"# CMake generated Testfile for ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# Source directory: ");
    pcVar3 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# Build directory: ");
    pcVar3 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# This file includes the relevant testing commands ");
    poVar4 = std::operator<<(poVar4,"required for ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# testing this directory and lists subdirectories to ");
    poVar4 = std::operator<<(poVar4,"be tested as well.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar8 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_320,"TEST_INCLUDE_FILE",(allocator *)((long)&testers + 7));
    pcVar3 = cmMakefile::GetProperty(pcVar8,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testers + 7));
    local_300 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)&testIncludeFile,"include(\"");
      poVar4 = std::operator<<(poVar4,local_300);
      poVar4 = std::operator<<(poVar4,"\")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    gi._M_current = (cmTestGenerator **)cmMakefile::GetTestGenerators(this->Makefile);
    local_338._M_current =
         (cmTestGenerator **)
         std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::begin
                   ((vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *)gi._M_current);
    while( true ) {
      i = (size_t)std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::end
                            ((vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *)
                             gi._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_338,
                         (__normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                          *)&i);
      if (!bVar2) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                ::operator*(&local_338);
      cmScriptGenerator::Generate
                (&(*ppcVar5)->super_cmScriptGenerator,(ostream *)&testIncludeFile,
                 (string *)((long)&file.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      __gnu_cxx::
      __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
      ::operator++(&local_338);
    }
    bVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty
                      (&this->Children);
    if (!bVar2) {
      for (outP.field_2._8_8_ = 0; uVar1 = outP.field_2._8_8_,
          sVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                            (&this->Children), (ulong)uVar1 < sVar6;
          outP.field_2._8_8_ = outP.field_2._8_8_ + 1) {
        std::operator<<((ostream *)&testIncludeFile,"subdirs(");
        ppcVar7 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->Children,outP.field_2._8_8_);
        pcVar8 = GetMakefile(*ppcVar7);
        pcVar3 = cmMakefile::GetCurrentBinaryDirectory(pcVar8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_368,pcVar3,&local_369);
        std::allocator<char>::~allocator((allocator<char> *)&local_369);
        cmOutputConverter::Convert
                  (&local_390,&this->super_cmOutputConverter,(string *)local_368,START_OUTPUT,
                   UNCHANGED);
        std::operator<<((ostream *)&testIncludeFile,(string *)&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        poVar4 = std::operator<<((ostream *)&testIncludeFile,")");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_368);
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&testIncludeFile);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&config);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if ( !this->Makefile->IsOn("CMAKE_TESTING_ENABLED") )
    {
    return;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetCurrentBinaryDirectory();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetCurrentSourceDirectory() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetCurrentBinaryDirectory() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if ( testIncludeFile )
    {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
    }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const&
    testers = this->Makefile->GetTestGenerators();
  for(std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
      gi != testers.end(); ++gi)
    {
    (*gi)->Generate(fout, config, configurationTypes);
    }
  if (!this->Children.empty())
    {
    size_t i;
    for(i = 0; i < this->Children.size(); ++i)
      {
      // TODO: Use add_subdirectory instead?
      fout << "subdirs(";
      std::string outP =
        this->Children[i]->GetMakefile()->GetCurrentBinaryDirectory();
      fout << this->Convert(outP,START_OUTPUT);
      fout << ")" << std::endl;
      }
    }
}